

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  cmExpandedCommandArgument *argument;
  cmExpandedCommandArgument *argument_00;
  CompareOp op;
  _List_node_base *p_Var1;
  iterator iVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  CurrentAndTwoMoreIter args;
  CurrentAndTwoMoreIter args_00;
  CurrentAndTwoMoreIter args_01;
  CurrentAndTwoMoreIter args_02;
  CurrentAndTwoMoreIter args_03;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  iterator iVar15;
  bool bVar16;
  bool value;
  int iVar17;
  int iVar18;
  cmValue cVar19;
  string *psVar20;
  cmValue cVar21;
  ostream *poVar22;
  string *f2;
  Status SVar23;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var24;
  long lVar25;
  PolicyID id;
  PolicyID id_00;
  _List_node_base *p_Var26;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  static_string_view keyword_02;
  static_string_view keyword_03;
  static_string_view keyword_04;
  static_string_view keyword_05;
  static_string_view keyword_06;
  static_string_view keyword_07;
  static_string_view keyword_08;
  static_string_view keyword_09;
  static_string_view keyword_10;
  static_string_view keyword_11;
  static_string_view keyword_12;
  static_string_view keyword_13;
  static_string_view keyword_14;
  static_string_view keyword_15;
  static_string_view keyword_16;
  static_string_view keyword_17;
  static_string_view keyword_18;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string def_buf;
  ostringstream error;
  RegularExpression regEntry;
  string local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string *local_4e0;
  MessageType *local_4d8;
  cmList local_4d0;
  _List_node_base *local_4b8;
  _List_node_base *p_Stack_4b0;
  _List_node_base *local_4a8;
  _List_node_base *local_4a0;
  _List_node_base *p_Stack_498;
  _List_node_base *local_490;
  _List_node_base *local_488;
  _List_node_base *p_Stack_480;
  _List_node_base *local_478;
  _List_node_base *local_470;
  _List_node_base *p_Stack_468;
  _List_node_base *local_460;
  _List_node_base *local_458;
  _List_node_base *p_Stack_450;
  _List_node_base *local_448;
  _List_node_base *local_440;
  _List_node_base *p_Stack_438;
  _List_node_base *local_430;
  _List_node_base *local_428;
  _List_node_base *p_Stack_420;
  _List_node_base *local_418;
  _List_node_base *local_410;
  _List_node_base *p_Stack_408;
  _List_node_base *local_400;
  long *local_3f8 [2];
  long local_3e8 [2];
  path local_3d8 [2];
  ios_base local_368 [264];
  undefined1 local_260 [528];
  char *local_50;
  char *local_40;
  int local_38;
  
  p_Var1 = (newArgs->
           super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var26 = p_Var1;
  if (p_Var1 != (_List_node_base *)newArgs) {
    p_Var26 = p_Var1->_M_next;
  }
  local_4e0 = errorString;
  local_4d8 = status;
  iVar2._M_node = p_Var26;
  if (p_Var26 != (_List_node_base *)newArgs) {
    iVar2._M_node = p_Var26->_M_next;
  }
  do {
    if (p_Var1 == (_List_node_base *)newArgs) {
      return true;
    }
    if (p_Var26 != (_List_node_base *)newArgs) {
      argument_00 = (cmExpandedCommandArgument *)(p_Var1 + 1);
      keyword.super_string_view._M_str = DAT_00a36b38;
      keyword.super_string_view._M_len = (anonymous_namespace)::keyMATCHES;
      bVar16 = IsKeyword(this,keyword,argument_00);
      if (bVar16) {
        args.next._M_node = p_Var26;
        args.current._M_node = p_Var1;
        args.nextnext._M_node = iVar2._M_node;
        local_410 = p_Var1;
        p_Stack_408 = p_Var26;
        local_400 = iVar2._M_node;
        cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter>
                  (newArgs,false,args);
      }
      else if (iVar2._M_node != (_List_node_base *)newArgs) {
        argument = (cmExpandedCommandArgument *)(p_Var26 + 1);
        keyword_00.super_string_view._M_str = DAT_00a36b38;
        keyword_00.super_string_view._M_len = (anonymous_namespace)::keyMATCHES;
        bVar16 = IsKeyword(this,keyword_00,argument);
        pcVar12 = DAT_00a36b28;
        sVar11 = (anonymous_namespace)::keyLESS_EQUAL;
        pcVar10 = DAT_00a36ab8;
        sVar9 = (anonymous_namespace)::keyGREATER_EQUAL;
        pcVar8 = DAT_00a36aa8;
        sVar7 = (anonymous_namespace)::keyGREATER;
        pcVar6 = DAT_00a36a58;
        sVar5 = (anonymous_namespace)::keyEQUAL;
        if (bVar16) {
          cVar19 = GetDefinitionIfUnquoted(this,argument_00);
          local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
          local_540._M_string_length = 0;
          local_540.field_2._M_local_buf[0] = '\0';
          if (cVar19.Value == (string *)0x0) {
            cVar19.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00);
          }
          else {
            psVar20 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00);
            local_260._8_8_ = (psVar20->_M_dataplus)._M_p;
            local_260._0_8_ = psVar20->_M_string_length;
            __str._M_str = "CMAKE_MATCH_";
            __str._M_len = 0xc;
            iVar17 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_260,0,0xc,
                                __str);
            if (iVar17 == 0) {
              cVar19.Value = &local_540;
              std::__cxx11::string::_M_assign((string *)cVar19.Value);
            }
          }
          cmMakefile::ClearMatches(this->Makefile);
          psVar20 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                              ((cmExpandedCommandArgument *)(iVar2._M_node + 1));
          local_50 = (char *)0x0;
          local_40 = (char *)0x0;
          local_38 = 0;
          memset((RegularExpression *)local_260,0,0x20a);
          bVar16 = cmsys::RegularExpression::compile
                             ((RegularExpression *)local_260,(psVar20->_M_dataplus)._M_p);
          if (bVar16) {
            value = cmsys::RegularExpression::find
                              ((RegularExpression *)local_260,((cVar19.Value)->_M_dataplus)._M_p,
                               (RegularExpressionMatch *)local_260);
            if (value) {
              cmMakefile::StoreMatches(this->Makefile,(RegularExpression *)local_260);
            }
            args_00.next._M_node = p_Var26;
            args_00.current._M_node = p_Var1;
            args_00.nextnext._M_node = iVar2._M_node;
            local_4a0 = p_Var1;
            p_Stack_498 = p_Var26;
            local_490 = iVar2._M_node;
            cmArgumentList::ReduceTwoArgs(newArgs,value,args_00);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3d8,"Regular expression \"",0x14);
            poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d8,(psVar20->_M_dataplus)._M_p,
                                 psVar20->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\" cannot compile",0x10);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)local_4e0,(string *)local_3f8);
            if (local_3f8[0] != local_3e8) {
              operator_delete(local_3f8[0],local_3e8[0] + 1);
            }
            *local_4d8 = FATAL_ERROR;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
            std::ios_base::~ios_base(local_368);
          }
          if (local_40 != (char *)0x0) {
            operator_delete__(local_40);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != &local_540.field_2) {
            operator_delete(local_540._M_dataplus._M_p,
                            CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                                     local_540.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar16) {
            return false;
          }
        }
        else {
          keyword_01.super_string_view._M_str = DAT_00a36b18;
          keyword_01.super_string_view._M_len = (anonymous_namespace)::keyLESS;
          bVar16 = IsKeyword(this,keyword_01,argument);
          iVar17 = 1;
          if (bVar16) {
LAB_00537603:
            cVar19 = GetDefinitionIfUnquoted(this,argument_00);
            if (cVar19.Value == (string *)0x0) {
              cVar19.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00);
            }
            cVar21 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar2._M_node + 1));
            if (cVar21.Value == (string *)0x0) {
              cVar21.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                       ((cmExpandedCommandArgument *)(iVar2._M_node + 1));
            }
            bVar16 = false;
            iVar18 = __isoc99_sscanf(((cVar19.Value)->_M_dataplus)._M_p,"%lg",local_260);
            p_Var13 = p_Var1;
            p_Var14 = p_Var26;
            iVar15._M_node = iVar2._M_node;
            if (iVar18 == 1) {
              bVar16 = false;
              iVar18 = __isoc99_sscanf(((cVar21.Value)->_M_dataplus)._M_p,"%lg",local_3d8);
              if (iVar18 == 1) {
                if (iVar17 == 3) {
                  bVar16 = (double)local_260._0_8_ <
                           (double)local_3d8[0]._M_pathname._M_dataplus._M_p;
LAB_005378c7:
                  bVar16 = !bVar16 &&
                           (double)local_3d8[0]._M_pathname._M_dataplus._M_p !=
                           (double)local_260._0_8_;
                }
                else {
                  if (iVar17 == 2) {
                    bVar16 = (double)local_3d8[0]._M_pathname._M_dataplus._M_p <
                             (double)local_260._0_8_;
                  }
                  else {
                    if (iVar17 == 1) {
                      bVar16 = (double)local_3d8[0]._M_pathname._M_dataplus._M_p <
                               (double)local_260._0_8_;
                      goto LAB_005378c7;
                    }
                    if (iVar17 != 4) {
                      bVar16 = (double)local_260._0_8_ ==
                               (double)local_3d8[0]._M_pathname._M_dataplus._M_p && iVar17 == 5;
                      goto LAB_00537aa2;
                    }
                    bVar16 = (double)local_260._0_8_ <
                             (double)local_3d8[0]._M_pathname._M_dataplus._M_p;
                  }
                  bVar16 = !bVar16;
                }
              }
            }
          }
          else {
            keyword_02.super_string_view._M_str = pcVar12;
            keyword_02.super_string_view._M_len = sVar11;
            bVar16 = IsKeyword(this,keyword_02,argument);
            iVar17 = 2;
            if (bVar16) goto LAB_00537603;
            keyword_03.super_string_view._M_str = pcVar8;
            keyword_03.super_string_view._M_len = sVar7;
            bVar16 = IsKeyword(this,keyword_03,argument);
            iVar17 = 3;
            if (bVar16) goto LAB_00537603;
            keyword_04.super_string_view._M_str = pcVar10;
            keyword_04.super_string_view._M_len = sVar9;
            bVar16 = IsKeyword(this,keyword_04,argument);
            iVar17 = 4;
            if (bVar16) goto LAB_00537603;
            keyword_05.super_string_view._M_str = pcVar6;
            keyword_05.super_string_view._M_len = sVar5;
            bVar16 = IsKeyword(this,keyword_05,argument);
            pcVar12 = DAT_00a36bd8;
            sVar11 = (anonymous_namespace)::keySTRLESS_EQUAL;
            pcVar10 = DAT_00a36bb8;
            sVar9 = (anonymous_namespace)::keySTRGREATER_EQUAL;
            pcVar8 = DAT_00a36ba8;
            sVar7 = (anonymous_namespace)::keySTRGREATER;
            pcVar6 = DAT_00a36b98;
            sVar5 = (anonymous_namespace)::keySTREQUAL;
            iVar17 = 5;
            if (bVar16) goto LAB_00537603;
            keyword_06.super_string_view._M_str = DAT_00a36bc8;
            keyword_06.super_string_view._M_len = (anonymous_namespace)::keySTRLESS;
            bVar16 = IsKeyword(this,keyword_06,argument);
            iVar17 = 1;
            if (!bVar16) {
              keyword_07.super_string_view._M_str = pcVar12;
              keyword_07.super_string_view._M_len = sVar11;
              bVar16 = IsKeyword(this,keyword_07,argument);
              iVar17 = 2;
              if (!bVar16) {
                keyword_08.super_string_view._M_str = pcVar8;
                keyword_08.super_string_view._M_len = sVar7;
                bVar16 = IsKeyword(this,keyword_08,argument);
                iVar17 = 3;
                if (!bVar16) {
                  keyword_09.super_string_view._M_str = pcVar10;
                  keyword_09.super_string_view._M_len = sVar9;
                  bVar16 = IsKeyword(this,keyword_09,argument);
                  iVar17 = 4;
                  if (!bVar16) {
                    keyword_10.super_string_view._M_str = pcVar6;
                    keyword_10.super_string_view._M_len = sVar5;
                    bVar16 = IsKeyword(this,keyword_10,argument);
                    pcVar12 = DAT_00a36c48;
                    sVar11 = (anonymous_namespace)::keyVERSION_LESS_EQUAL;
                    pcVar10 = DAT_00a36c28;
                    sVar9 = (anonymous_namespace)::keyVERSION_GREATER_EQUAL;
                    pcVar8 = DAT_00a36c18;
                    sVar7 = (anonymous_namespace)::keyVERSION_GREATER;
                    pcVar6 = DAT_00a36c08;
                    sVar5 = (anonymous_namespace)::keyVERSION_EQUAL;
                    iVar17 = 5;
                    if (!bVar16) {
                      keyword_11.super_string_view._M_str = DAT_00a36c38;
                      keyword_11.super_string_view._M_len = (anonymous_namespace)::keyVERSION_LESS;
                      bVar16 = IsKeyword(this,keyword_11,argument);
                      if (bVar16) {
                        lVar25 = 0;
LAB_00537c32:
                        op = (&(anonymous_namespace)::MATCH2CMPOP)[lVar25];
                        cVar19 = GetDefinitionIfUnquoted(this,argument_00);
                        if (cVar19.Value == (string *)0x0) {
                          cVar19.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00)
                          ;
                        }
                        cVar21 = GetDefinitionIfUnquoted
                                           (this,(cmExpandedCommandArgument *)(iVar2._M_node + 1));
                        if (cVar21.Value == (string *)0x0) {
                          cVar21.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                                   ((cmExpandedCommandArgument *)(iVar2._M_node + 1)
                                                   );
                        }
                        bVar16 = cmSystemTools::VersionCompare(op,cVar19.Value,cVar21.Value);
                        local_458 = p_Var1;
                        p_Stack_450 = p_Var26;
                        local_448 = iVar2._M_node;
                      }
                      else {
                        keyword_12.super_string_view._M_str = pcVar12;
                        keyword_12.super_string_view._M_len = sVar11;
                        bVar16 = IsKeyword(this,keyword_12,argument);
                        lVar25 = 1;
                        if (bVar16) goto LAB_00537c32;
                        keyword_13.super_string_view._M_str = pcVar8;
                        keyword_13.super_string_view._M_len = sVar7;
                        bVar16 = IsKeyword(this,keyword_13,argument);
                        lVar25 = 2;
                        if (bVar16) goto LAB_00537c32;
                        keyword_14.super_string_view._M_str = pcVar10;
                        keyword_14.super_string_view._M_len = sVar9;
                        bVar16 = IsKeyword(this,keyword_14,argument);
                        lVar25 = 3;
                        if (bVar16) goto LAB_00537c32;
                        keyword_15.super_string_view._M_str = pcVar6;
                        keyword_15.super_string_view._M_len = sVar5;
                        bVar16 = IsKeyword(this,keyword_15,argument);
                        lVar25 = 4;
                        if (bVar16) goto LAB_00537c32;
                        keyword_16.super_string_view._M_str = DAT_00a36af8;
                        keyword_16.super_string_view._M_len =
                             (anonymous_namespace)::keyIS_NEWER_THAN;
                        bVar16 = IsKeyword(this,keyword_16,argument);
                        if (!bVar16) {
                          keyword_17.super_string_view._M_str = DAT_00a36ac8;
                          keyword_17.super_string_view._M_len = (anonymous_namespace)::keyIN_LIST;
                          bVar16 = IsKeyword(this,keyword_17,argument);
                          if (bVar16) {
                            if (this->Policy57Status < NEW) {
                              if (this->Policy57Status == WARN) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_260);
                                cmPolicies::GetPolicyWarning_abi_cxx11_
                                          (&local_3d8[0]._M_pathname,(cmPolicies *)0x39,id);
                                poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_260,
                                                     local_3d8[0]._M_pathname._M_dataplus._M_p,
                                                     local_3d8[0]._M_pathname._M_string_length);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar22,
                                           "\nIN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                                           ,0x86);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_3d8[0]._M_pathname._M_dataplus._M_p !=
                                    &local_3d8[0]._M_pathname.field_2) {
                                  operator_delete(local_3d8[0]._M_pathname._M_dataplus._M_p,
                                                  local_3d8[0]._M_pathname.field_2.
                                                  _M_allocated_capacity + 1);
                                }
                                pcVar3 = this->Makefile;
                                std::__cxx11::stringbuf::str();
                                cmMakefile::IssueMessage
                                          (pcVar3,AUTHOR_WARNING,&local_3d8[0]._M_pathname);
LAB_00537f4f:
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_3d8[0]._M_pathname._M_dataplus._M_p !=
                                    &local_3d8[0]._M_pathname.field_2) {
                                  operator_delete(local_3d8[0]._M_pathname._M_dataplus._M_p,
                                                  local_3d8[0]._M_pathname.field_2.
                                                  _M_allocated_capacity + 1);
                                }
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_260);
                                std::ios_base::~ios_base((ios_base *)(local_260 + 0x70));
                              }
                            }
                            else {
                              cVar19 = GetVariableOrString(this,argument_00);
                              pcVar3 = this->Makefile;
                              psVar20 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                                  ((cmExpandedCommandArgument *)(iVar2._M_node + 1))
                              ;
                              cVar21 = cmMakefile::GetDefinition(pcVar3,psVar20);
                              if (cVar21.Value == (string *)0x0) {
                                bVar16 = false;
                              }
                              else {
                                cmList::cmList(&local_4d0,cVar21.Value,Yes,Yes);
                                _Var24 = std::
                                         __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                                   (local_4d0.Values.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  local_4d0.Values.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,
                                                  cVar19.Value);
                                bVar16 = _Var24._M_current !=
                                         local_4d0.Values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish;
                              }
                              args_03.next._M_node = p_Var26;
                              args_03.current._M_node = p_Var1;
                              args_03.nextnext._M_node = iVar2._M_node;
                              local_4b8 = p_Var1;
                              p_Stack_4b0 = p_Var26;
                              local_4a8 = iVar2._M_node;
                              cmArgumentList::ReduceTwoArgs(newArgs,bVar16,args_03);
                              if (cVar21.Value != (string *)0x0) {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector(&local_4d0.Values);
                              }
                            }
                          }
                          else {
                            keyword_18.super_string_view._M_str = DAT_00a36c58;
                            keyword_18.super_string_view._M_len =
                                 (anonymous_namespace)::keyPATH_EQUAL;
                            bVar16 = IsKeyword(this,keyword_18,argument);
                            if (bVar16) {
                              if (WARN < this->Policy139Status) {
                                cVar19 = GetVariableOrString(this,argument_00);
                                cVar21 = GetVariableOrString(this,(cmExpandedCommandArgument *)
                                                                  (iVar2._M_node + 1));
                                local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
                                pcVar4 = ((cVar19.Value)->_M_dataplus)._M_p;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)&local_500,pcVar4,
                                           pcVar4 + (cVar19.Value)->_M_string_length);
                                cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                                          ((cmCMakePath *)local_260,&local_500,generic_format);
                                local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
                                pcVar4 = ((cVar21.Value)->_M_dataplus)._M_p;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)&local_520,pcVar4,
                                           pcVar4 + (cVar21.Value)->_M_string_length);
                                cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                                          ((cmCMakePath *)local_3d8,&local_520,generic_format);
                                iVar17 = std::filesystem::__cxx11::path::compare((path *)local_260);
                                std::filesystem::__cxx11::path::~path(local_3d8);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_520._M_dataplus._M_p != &local_520.field_2) {
                                  operator_delete(local_520._M_dataplus._M_p,
                                                  local_520.field_2._M_allocated_capacity + 1);
                                }
                                std::filesystem::__cxx11::path::~path((path *)local_260);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_500._M_dataplus._M_p != &local_500.field_2) {
                                  operator_delete(local_500._M_dataplus._M_p,
                                                  local_500.field_2._M_allocated_capacity + 1);
                                }
                                bVar16 = iVar17 == 0;
                                local_488 = p_Var1;
                                p_Stack_480 = p_Var26;
                                local_478 = iVar2._M_node;
                                goto LAB_00537cbd;
                              }
                              if (this->Policy139Status == WARN) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_260);
                                cmPolicies::GetPolicyWarning_abi_cxx11_
                                          (&local_3d8[0]._M_pathname,(cmPolicies *)0x8b,id_00);
                                poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_260,
                                                     local_3d8[0]._M_pathname._M_dataplus._M_p,
                                                     local_3d8[0]._M_pathname._M_string_length);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar22,
                                           "\nPATH_EQUAL will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                                           ,0x89);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_3d8[0]._M_pathname._M_dataplus._M_p !=
                                    &local_3d8[0]._M_pathname.field_2) {
                                  operator_delete(local_3d8[0]._M_pathname._M_dataplus._M_p,
                                                  local_3d8[0]._M_pathname.field_2.
                                                  _M_allocated_capacity + 1);
                                }
                                pcVar3 = this->Makefile;
                                std::__cxx11::stringbuf::str();
                                cmMakefile::IssueMessage
                                          (pcVar3,AUTHOR_WARNING,&local_3d8[0]._M_pathname);
                                goto LAB_00537f4f;
                              }
                            }
                          }
                          goto LAB_00537aaa;
                        }
                        local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
                        psVar20 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00);
                        f2 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                       ((cmExpandedCommandArgument *)(iVar2._M_node + 1));
                        SVar23 = cmsys::SystemTools::FileTimeCompare(psVar20,f2,(int *)local_260);
                        bVar16 = (uint)local_260._0_4_ < 2 || SVar23.Kind_ != Success;
                        local_470 = p_Var1;
                        p_Stack_468 = p_Var26;
                        local_460 = iVar2._M_node;
                      }
LAB_00537cbd:
                      args_02.next._M_node = p_Var26;
                      args_02.current._M_node = p_Var1;
                      args_02.nextnext._M_node = iVar2._M_node;
                      cmArgumentList::ReduceTwoArgs(newArgs,bVar16,args_02);
                      goto LAB_00537aaa;
                    }
                  }
                }
              }
            }
            cVar19 = GetDefinitionIfUnquoted(this,argument_00);
            if (cVar19.Value == (string *)0x0) {
              cVar19.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00);
            }
            cVar21 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar2._M_node + 1));
            if (cVar21.Value == (string *)0x0) {
              cmExpandedCommandArgument::GetValue_abi_cxx11_
                        ((cmExpandedCommandArgument *)(iVar2._M_node + 1));
            }
            iVar18 = std::__cxx11::string::compare((string *)cVar19.Value);
            local_440 = p_Var1;
            p_Stack_438 = p_Var26;
            local_430 = iVar2._M_node;
            p_Var13 = local_428;
            p_Var14 = p_Stack_420;
            iVar15._M_node = local_418;
            if (iVar17 == 3) {
              bVar16 = 0 < iVar18;
            }
            else if (iVar17 == 2) {
              bVar16 = iVar18 < 1;
            }
            else if (iVar17 == 1) {
              bVar16 = SUB41((uint)iVar18 >> 0x1f,0);
            }
            else if (iVar17 == 4) {
              bVar16 = -1 < iVar18;
            }
            else {
              bVar16 = iVar17 == 5 && iVar18 == 0;
            }
          }
LAB_00537aa2:
          local_418 = iVar15._M_node;
          p_Stack_420 = p_Var14;
          local_428 = p_Var13;
          args_01.next._M_node = p_Var26;
          args_01.current._M_node = p_Var1;
          args_01.nextnext._M_node = iVar2._M_node;
          cmArgumentList::ReduceTwoArgs(newArgs,bVar16,args_01);
        }
      }
    }
LAB_00537aaa:
    p_Var1 = p_Var1->_M_next;
    p_Var26 = p_Var1;
    if (p_Var1 != (_List_node_base *)newArgs) {
      p_Var26 = p_Var1->_M_next;
    }
    iVar2._M_node = p_Var26;
    if (p_Var26 != (_List_node_base *)newArgs) {
      iVar2._M_node = p_Var26->_M_next;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make3ArgsIterator(); args.current != newArgs.end();
       args.advance(newArgs)) {

    int matchNo;

    // NOTE Handle special case `if(... BLAH_BLAH MATCHES)`
    // (i.e., w/o regex to match which is possibly result of
    // variable expansion to an empty string)
    if (args.next != newArgs.end() &&
        this->IsKeyword(keyMATCHES, *args.current)) {
      newArgs.ReduceOneArg(false, args);
    }

    // NOTE Fail fast: All the binary ops below require 2 arguments.
    else if (args.next == newArgs.end() || args.nextnext == newArgs.end()) {
      continue;
    }

    else if (this->IsKeyword(keyMATCHES, *args.next)) {
      cmValue def = this->GetDefinitionIfUnquoted(*args.current);

      std::string def_buf;
      if (!def) {
        def = cmValue(args.current->GetValue());
      } else if (cmHasLiteralPrefix(args.current->GetValue(),
                                    "CMAKE_MATCH_")) {
        // The string to match is owned by our match result variables.
        // Move it to our own buffer before clearing them.
        def_buf = *def;
        def = cmValue(def_buf);
      }

      this->Makefile.ClearMatches();

      const auto& rex = args.nextnext->GetValue();
      cmsys::RegularExpression regEntry;
      if (!regEntry.compile(rex)) {
        std::ostringstream error;
        error << "Regular expression \"" << rex << "\" cannot compile";
        errorString = error.str();
        status = MessageType::FATAL_ERROR;
        return false;
      }

      const auto match = regEntry.find(*def);
      if (match) {
        this->Makefile.StoreMatches(regEntry);
      }
      newArgs.ReduceTwoArgs(match, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyLESS, keyLESS_EQUAL, keyGREATER,
                                keyGREATER_EQUAL, keyEQUAL))) {

      cmValue ldef = this->GetVariableOrString(*args.current);
      cmValue rdef = this->GetVariableOrString(*args.nextnext);

      double lhs;
      double rhs;
      auto parseDoubles = [&]() {
        return std::sscanf(ldef->c_str(), "%lg", &lhs) == 1 &&
          std::sscanf(rdef->c_str(), "%lg", &rhs) == 1;
      };
      // clang-format off
      const auto result = parseDoubles() &&
        cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, lhs, rhs);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo = this->matchKeys(*args.next, keySTRLESS,
                                        keySTRLESS_EQUAL, keySTRGREATER,
                                        keySTRGREATER_EQUAL, keySTREQUAL))) {

      const cmValue lhs = this->GetVariableOrString(*args.current);
      const cmValue rhs = this->GetVariableOrString(*args.nextnext);
      const auto val = (*lhs).compare(*rhs);
      // clang-format off
      const auto result = cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, val, 0);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyVERSION_LESS,
                                keyVERSION_LESS_EQUAL, keyVERSION_GREATER,
                                keyVERSION_GREATER_EQUAL, keyVERSION_EQUAL))) {
      const auto op = MATCH2CMPOP[matchNo - 1];
      const cmValue lhs = this->GetVariableOrString(*args.current);
      const cmValue rhs = this->GetVariableOrString(*args.nextnext);
      const auto result = cmSystemTools::VersionCompare(op, lhs, rhs);
      newArgs.ReduceTwoArgs(result, args);
    }

    // is file A newer than file B
    else if (this->IsKeyword(keyIS_NEWER_THAN, *args.next)) {
      auto fileIsNewer = 0;
      cmsys::Status ftcStatus = cmSystemTools::FileTimeCompare(
        args.current->GetValue(), args.nextnext->GetValue(), &fileIsNewer);
      newArgs.ReduceTwoArgs(
        (!ftcStatus || fileIsNewer == 1 || fileIsNewer == 0), args);
    }

    else if (this->IsKeyword(keyIN_LIST, *args.next)) {

      if (this->Policy57Status != cmPolicies::OLD &&
          this->Policy57Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->Makefile.GetDefinition(args.nextnext->GetValue());

        newArgs.ReduceTwoArgs(
          rhs &&
            cm::contains(cmList{ *rhs, cmList::EmptyElements::Yes }, *lhs),
          args);
      }

      else if (this->Policy57Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057)
          << "\n"
             "IN_LIST will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }

    else if (this->IsKeyword(keyPATH_EQUAL, *args.next)) {

      if (this->Policy139Status != cmPolicies::OLD &&
          this->Policy139Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->GetVariableOrString(*args.nextnext);
        const auto result = cmCMakePath{ *lhs } == cmCMakePath{ *rhs };
        newArgs.ReduceTwoArgs(result, args);
      }

      else if (this->Policy139Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0139)
          << "\n"
             "PATH_EQUAL will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }
  }
  return true;
}